

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::apply_and_log_current_params(raft_server *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  element_type *peVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ptr<raft_params> params;
  string local_a0;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  char *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  element_type *local_38;
  
  context::get_params((context *)&params);
  if (((this->test_mode_flag_)._M_base._M_i & 1U) == 0) {
    if (*(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                4) <=
        *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                8)) {
      *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
              ) = *(int *)(params.
                           super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 8) * 2;
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar4 != (element_type *)0x0) {
        iVar5 = (**(code **)(*(long *)peVar4 + 0x38))();
        if (2 < iVar5) {
          peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a0,"invalid election timeout lower bound detected, adjusted to %d",
                     (ulong)*(uint *)(params.
                                      super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 4));
          (**(code **)(*(long *)peVar4 + 0x40))
                    (peVar4,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"apply_and_log_current_params",0x175,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
        }
      }
    }
    if (*(int *)params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr <=
        *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                4)) {
      *(int *)params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 4) * 2;
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar4 != (element_type *)0x0) {
        iVar5 = (**(code **)(*(long *)peVar4 + 0x38))();
        if (2 < iVar5) {
          peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a0,"invalid election timeout upper bound detected, adjusted to %d",
                     (ulong)*(uint *)params.
                                     super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
          (**(code **)(*(long *)peVar4 + 0x40))
                    (peVar4,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"apply_and_log_current_params",0x17c,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
        }
      }
    }
  }
  peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 != (element_type *)0x0) {
    iVar5 = (**(code **)(*(long *)peVar4 + 0x38))();
    if (3 < iVar5) {
      local_38 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar1 = *(uint *)params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
      uVar2 = *(uint *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 4);
      uVar3 = *(uint *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 8);
      uVar6 = get_leadership_expiry(this);
      local_40 = (ulong)*(uint *)(params.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x24);
      local_48 = (ulong)*(uint *)(params.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x18);
      local_58 = "NO";
      if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x20] !=
          (element_type)0x0) {
        local_58 = "YES";
      }
      local_50 = (ulong)*(uint *)(params.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0xc);
      pcVar9 = "OFF";
      pcVar11 = "OFF";
      if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x49] !=
          (element_type)0x0) {
        pcVar11 = "ON";
      }
      local_60 = (ulong)*(uint *)(params.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x14);
      pcVar7 = "ASYNC";
      pcVar8 = "ASYNC";
      if (*(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  + 0x58) == 0) {
        pcVar8 = "BLOCKING";
      }
      local_68 = (ulong)*(uint *)(params.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x28);
      pcVar10 = "INCLUDED";
      if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x51] !=
          (element_type)0x0) {
        pcVar10 = "EXCLUDED";
      }
      local_70 = (ulong)*(uint *)(params.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x2c);
      if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr[100] ==
          (element_type)0x0) {
        pcVar7 = "BLOCKING";
      }
      if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x66] !=
          (element_type)0x0) {
        pcVar9 = "ON";
      }
      local_78 = (ulong)*(uint *)(params.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x38);
      local_80 = (ulong)*(uint *)(params.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x3c);
      msg_if_given_abi_cxx11_
                (&local_a0,
                 "parameters: timeout %d - %d, heartbeat %d, leadership expiry %d, max batch %d, backoff %d, snapshot distance %d, enable randomized snapshot creation %s, log sync stop gap %d, reserved logs %d, client timeout %d, auto forwarding %s, API call type %s, custom commit quorum size %d, custom election quorum size %d, snapshot receiver %s, leadership transfer wait time %d, grace period of lagging state machine %d, snapshot IO: %s, parallel log appending: %s"
                 ,(ulong)uVar2,(ulong)uVar1,(ulong)uVar3,(ulong)uVar6,local_40,local_50,local_48,
                 local_58,local_60,local_68,local_70,pcVar11,pcVar8,local_78,local_80,pcVar10,
                 (ulong)*(uint *)(params.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x44),
                 (ulong)*(uint *)(params.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x60),pcVar7,pcVar9);
      (**(code **)(*(long *)local_38 + 0x40))
                (local_38,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"apply_and_log_current_params",0x1a3,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    }
  }
  timer_helper::set_duration_us
            (&this->status_check_timer_,
             (long)*(int *)(params.
                            super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 8) * 1000);
  timer_helper::reset(&this->status_check_timer_);
  timer_helper::set_duration_us
            (&this->leadership_transfer_timer_,
             (long)*(int *)(params.
                            super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 0x44) * 1000);
  if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void raft_server::apply_and_log_current_params() {
    ptr<raft_params> params = ctx_->get_params();

    if (!test_mode_flag_) {
        if (params->heart_beat_interval_ >= params->election_timeout_lower_bound_) {
            params->election_timeout_lower_bound_ = params->heart_beat_interval_ * 2;
            p_wn("invalid election timeout lower bound detected, adjusted to %d",
                 params->election_timeout_lower_bound_);
        }
        if (params->election_timeout_lower_bound_
            >= params->election_timeout_upper_bound_) {
            params->election_timeout_upper_bound_ =
                params->election_timeout_lower_bound_ * 2;
            p_wn("invalid election timeout upper bound detected, adjusted to %d",
                 params->election_timeout_upper_bound_);
        }
    }

    p_in( "parameters: "
          "timeout %d - %d, heartbeat %d, "
          "leadership expiry %d, "
          "max batch %d, backoff %d, snapshot distance %d, "
          "enable randomized snapshot creation %s, "
          "log sync stop gap %d, "
          "reserved logs %d, client timeout %d, "
          "auto forwarding %s, API call type %s, "
          "custom commit quorum size %d, "
          "custom election quorum size %d, "
          "snapshot receiver %s, "
          "leadership transfer wait time %d, "
          "grace period of lagging state machine %d, "
          "snapshot IO: %s, "
          "parallel log appending: %s",
          params->election_timeout_lower_bound_,
          params->election_timeout_upper_bound_,
          params->heart_beat_interval_,
          get_leadership_expiry(),
          params->max_append_size_,
          params->rpc_failure_backoff_,
          params->snapshot_distance_,
          params->enable_randomized_snapshot_creation_ ? "YES" : "NO",
          params->log_sync_stop_gap_,
          params->reserved_log_items_,
          params->client_req_timeout_,
          ( params->auto_forwarding_ ? "ON" : "OFF" ),
          ( params->return_method_ == raft_params::blocking
            ? "BLOCKING" : "ASYNC" ),
          params->custom_commit_quorum_size_,
          params->custom_election_quorum_size_,
          params->exclude_snp_receiver_from_quorum_ ? "EXCLUDED" : "INCLUDED",
          params->leadership_transfer_min_wait_time_,
          params->grace_period_of_lagging_state_machine_,
          params->use_bg_thread_for_snapshot_io_ ? "ASYNC" : "BLOCKING",
          params->parallel_log_appending_ ? "ON" : "OFF" );

    status_check_timer_.set_duration_ms(params->heart_beat_interval_);
    status_check_timer_.reset();

    leadership_transfer_timer_.set_duration_ms
        (params->leadership_transfer_min_wait_time_);
}